

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyCertificateIsSelfSigned_SelfSigned_Test::~VerifyCertificateIsSelfSigned_SelfSigned_Test
          (VerifyCertificateIsSelfSigned_SelfSigned_Test *this)

{
  VerifyCertificateIsSelfSigned_SelfSigned_Test *this_local;
  
  ~VerifyCertificateIsSelfSigned_SelfSigned_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VerifyCertificateIsSelfSigned, SelfSigned) {
  auto cert = ReadCertFromFile(
      "testdata/verify_certificate_chain_unittest/target-selfsigned/chain.pem");
  ASSERT_TRUE(cert);

  // Test with null cache and errors.
  EXPECT_TRUE(VerifyCertificateIsSelfSigned(*cert, /*cache=*/nullptr,
                                            /*errors=*/nullptr));

  // Test with cache and errors.
  CertErrors errors;
  MockSignatureVerifyCache cache;
  EXPECT_TRUE(VerifyCertificateIsSelfSigned(*cert, &cache, &errors));

  EXPECT_FALSE(errors.ContainsAnyErrorWithSeverity(
      CertError::Severity::SEVERITY_WARNING));
  EXPECT_FALSE(
      errors.ContainsAnyErrorWithSeverity(CertError::Severity::SEVERITY_HIGH));

  EXPECT_EQ(cache.CacheHits(), 0U);
  EXPECT_EQ(cache.CacheMisses(), 1U);
  EXPECT_EQ(cache.CacheStores(), 1U);

  // Trying again should use cached signature verification result.
  EXPECT_TRUE(VerifyCertificateIsSelfSigned(*cert, &cache, &errors));
  EXPECT_EQ(cache.CacheHits(), 1U);
  EXPECT_EQ(cache.CacheMisses(), 1U);
  EXPECT_EQ(cache.CacheStores(), 1U);
}